

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O2

QAbstractItemDelegate * __thiscall
QAbstractItemViewPrivate::delegateForIndex(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  Data *pDVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = index->r;
  cVar2._M_node =
       (_Base_ptr)QMap<int,_QPointer<QAbstractItemDelegate>_>::find(&this->rowDelegates,&local_1c);
  cVar4._M_node = (_Base_ptr)(this->rowDelegates).d.d.ptr;
  if ((QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
       *)cVar4._M_node !=
      (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
       *)0x0) {
    cVar4._M_node =
         &(((QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
             *)cVar4._M_node)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  if (cVar2._M_node == cVar4._M_node) {
    local_1c = index->c;
    cVar2._M_node =
         (_Base_ptr)
         QMap<int,_QPointer<QAbstractItemDelegate>_>::find(&this->columnDelegates,&local_1c);
    cVar4._M_node = (_Base_ptr)(this->columnDelegates).d.d.ptr;
    if ((QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
         *)cVar4._M_node !=
        (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
         *)0x0) {
      cVar4._M_node =
           &(((QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
               *)cVar4._M_node)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    }
    if (cVar2._M_node != cVar4._M_node) goto LAB_004ec901;
    pDVar1 = (this->itemDelegate).wp.d;
    if ((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) {
      p_Var3 = (_Base_ptr)(this->itemDelegate).wp.value;
      goto LAB_004ec935;
    }
  }
  else {
LAB_004ec901:
    if ((cVar2._M_node[1]._M_parent != (_Base_ptr)0x0) &&
       (*(int *)&(cVar2._M_node[1]._M_parent)->field_0x4 != 0)) {
      p_Var3 = cVar2._M_node[1]._M_left;
      goto LAB_004ec935;
    }
  }
  p_Var3 = (_Base_ptr)0x0;
LAB_004ec935:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QAbstractItemDelegate *)p_Var3;
  }
  __stack_chk_fail();
}

Assistant:

inline QAbstractItemDelegate *delegateForIndex(const QModelIndex &index) const {
        QMap<int, QPointer<QAbstractItemDelegate> >::ConstIterator it;

        it = rowDelegates.find(index.row());
        if (it != rowDelegates.end())
            return it.value();

        it = columnDelegates.find(index.column());
        if (it != columnDelegates.end())
            return it.value();

        return itemDelegate;
    }